

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_mul(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  uint uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  undefined1 auVar89 [16];
  uint64_t p2;
  uint64_t p1;
  uint64_t p0;
  uint64_t m6;
  uint64_t m5;
  uint64_t m4;
  uint64_t m3;
  uint64_t m2;
  uint64_t m1;
  uint64_t m0;
  uint64_t l [8];
  uint local_e0;
  ulong local_48;
  ulong local_40;
  uint64_t c;
  uint64_t p4;
  uint64_t p3;
  
  uVar61 = a->d[0];
  uVar63 = a->d[1];
  uVar65 = a->d[2];
  uVar62 = b->d[0];
  uVar64 = b->d[1];
  uVar71 = b->d[2];
  uVar72 = b->d[3];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar61;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar62;
  uVar66 = SUB168(auVar3 * auVar19,8);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar66;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar61;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar64;
  auVar4 = auVar4 * auVar20;
  uVar75 = SUB168(auVar4 + auVar57,0);
  uVar81 = SUB168(auVar4 + auVar57,8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar63;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar62;
  uVar67 = SUB168(auVar5 * auVar21,8);
  uVar60 = SUB168(auVar5 * auVar21,0);
  uVar76 = uVar75 + uVar60;
  uVar60 = (ulong)CARRY8(uVar75,uVar60);
  uVar75 = uVar81 + uVar67;
  uVar82 = uVar75 + uVar60;
  uVar84 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar66,auVar4._0_8_)) +
           (ulong)(CARRY8(uVar81,uVar67) || CARRY8(uVar75,uVar60));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar61;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar71;
  uVar68 = SUB168(auVar6 * auVar22,8);
  uVar60 = SUB168(auVar6 * auVar22,0);
  uVar66 = uVar82 + uVar60;
  uVar60 = (ulong)CARRY8(uVar82,uVar60);
  uVar67 = uVar84 + uVar68;
  uVar85 = uVar67 + uVar60;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar63;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar64;
  uVar69 = SUB168(auVar7 * auVar23,8);
  uVar75 = SUB168(auVar7 * auVar23,0);
  uVar82 = uVar66 + uVar75;
  uVar75 = (ulong)CARRY8(uVar66,uVar75);
  uVar81 = uVar85 + uVar69;
  uVar86 = uVar81 + uVar75;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar65;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar62;
  uVar70 = SUB168(auVar8 * auVar24,8);
  uVar66 = SUB168(auVar8 * auVar24,0);
  uVar83 = uVar82 + uVar66;
  uVar66 = (ulong)CARRY8(uVar82,uVar66);
  uVar82 = uVar86 + uVar70;
  uVar87 = uVar82 + uVar66;
  uVar86 = (ulong)(CARRY8(uVar84,uVar68) || CARRY8(uVar67,uVar60)) +
           (ulong)(CARRY8(uVar85,uVar69) || CARRY8(uVar81,uVar75)) +
           (ulong)(CARRY8(uVar86,uVar70) || CARRY8(uVar82,uVar66));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar61;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar72;
  uVar69 = SUB168(auVar9 * auVar25,8);
  uVar61 = SUB168(auVar9 * auVar25,0);
  uVar66 = uVar87 + uVar61;
  uVar60 = (ulong)CARRY8(uVar87,uVar61);
  uVar67 = uVar86 + uVar69;
  uVar87 = uVar67 + uVar60;
  uVar61 = a->d[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar63;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar71;
  uVar70 = SUB168(auVar10 * auVar26,8);
  uVar75 = SUB168(auVar10 * auVar26,0);
  uVar82 = uVar66 + uVar75;
  uVar75 = (ulong)CARRY8(uVar66,uVar75);
  uVar81 = uVar87 + uVar70;
  uVar77 = uVar81 + uVar75;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar65;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar64;
  uVar84 = SUB168(auVar11 * auVar27,8);
  uVar66 = SUB168(auVar11 * auVar27,0);
  uVar68 = uVar82 + uVar66;
  uVar66 = (ulong)CARRY8(uVar82,uVar66);
  uVar82 = uVar77 + uVar84;
  uVar78 = uVar82 + uVar66;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar61;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar62;
  uVar85 = SUB168(auVar12 * auVar28,8);
  uVar62 = SUB168(auVar12 * auVar28,0);
  uVar88 = uVar68 + uVar62;
  uVar62 = (ulong)CARRY8(uVar68,uVar62);
  uVar68 = uVar78 + uVar85;
  uVar79 = uVar68 + uVar62;
  uVar69 = (ulong)(CARRY8(uVar86,uVar69) || CARRY8(uVar67,uVar60)) +
           (ulong)(CARRY8(uVar87,uVar70) || CARRY8(uVar81,uVar75)) +
           (ulong)(CARRY8(uVar77,uVar84) || CARRY8(uVar82,uVar66)) +
           (ulong)(CARRY8(uVar78,uVar85) || CARRY8(uVar68,uVar62));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar63;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar72;
  uVar67 = SUB168(auVar13 * auVar29,8);
  uVar63 = SUB168(auVar13 * auVar29,0);
  uVar75 = uVar79 + uVar63;
  uVar63 = (ulong)CARRY8(uVar79,uVar63);
  uVar60 = uVar69 + uVar67;
  uVar70 = uVar60 + uVar63;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar65;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar71;
  uVar81 = SUB168(auVar14 * auVar30,8);
  uVar62 = SUB168(auVar14 * auVar30,0);
  uVar66 = uVar75 + uVar62;
  uVar62 = (ulong)CARRY8(uVar75,uVar62);
  uVar75 = uVar70 + uVar81;
  uVar84 = uVar75 + uVar62;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar61;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar64;
  uVar82 = SUB168(auVar15 * auVar31,8);
  uVar64 = SUB168(auVar15 * auVar31,0);
  uVar68 = uVar66 + uVar64;
  uVar64 = (ulong)CARRY8(uVar66,uVar64);
  uVar66 = uVar84 + uVar82;
  uVar85 = uVar66 + uVar64;
  uVar75 = (ulong)(CARRY8(uVar69,uVar67) || CARRY8(uVar60,uVar63)) +
           (ulong)(CARRY8(uVar70,uVar81) || CARRY8(uVar75,uVar62)) +
           (ulong)(CARRY8(uVar84,uVar82) || CARRY8(uVar66,uVar64));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar65;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar72;
  uVar60 = SUB168(auVar16 * auVar32,8);
  uVar63 = SUB168(auVar16 * auVar32,0);
  uVar64 = uVar85 + uVar63;
  uVar63 = (ulong)CARRY8(uVar85,uVar63);
  uVar62 = uVar75 + uVar60;
  uVar66 = uVar62 + uVar63;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar61;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar71;
  uVar71 = SUB168(auVar17 * auVar33,8);
  uVar65 = SUB168(auVar17 * auVar33,0);
  uVar69 = uVar64 + uVar65;
  uVar65 = (ulong)CARRY8(uVar64,uVar65);
  uVar64 = uVar66 + uVar71;
  auVar51._8_8_ =
       (ulong)(CARRY8(uVar75,uVar60) || CARRY8(uVar62,uVar63)) +
       (ulong)(CARRY8(uVar66,uVar71) || CARRY8(uVar64,uVar65));
  auVar51._0_8_ = uVar64 + uVar65;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar61;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar72;
  auVar51 = auVar18 * auVar34 + auVar51;
  local_48 = auVar51._0_8_;
  local_40 = auVar51._8_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = SUB168(auVar3 * auVar19,0);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar68;
  auVar52 = ZEXT816(0x402da1732fc9bebf) * auVar35 + auVar52;
  uVar61 = auVar52._8_8_;
  uVar65 = uVar61 + uVar76;
  uVar61 = (ulong)CARRY8(uVar61,uVar76);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar69;
  uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar36,8);
  uVar63 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar36,0);
  uVar64 = uVar65 + uVar63;
  uVar63 = (ulong)CARRY8(uVar65,uVar63);
  uVar62 = uVar61 + uVar71;
  uVar60 = uVar62 + uVar63;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar68;
  uVar72 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar37,8);
  uVar65 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar37,0);
  uVar70 = uVar64 + uVar65;
  uVar65 = (ulong)CARRY8(uVar64,uVar65);
  uVar64 = uVar60 + uVar72;
  uVar66 = uVar64 + uVar65;
  uVar75 = (ulong)(CARRY8(uVar61,uVar71) || CARRY8(uVar62,uVar63)) +
           (ulong)(CARRY8(uVar60,uVar72) || CARRY8(uVar64,uVar65));
  uVar65 = uVar66 + uVar83;
  uVar61 = (ulong)CARRY8(uVar66,uVar83);
  uVar66 = uVar75 + uVar61;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_48;
  uVar72 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,8);
  uVar63 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,0);
  uVar62 = uVar65 + uVar63;
  uVar63 = (ulong)CARRY8(uVar65,uVar63);
  uVar64 = uVar66 + uVar72;
  uVar67 = uVar64 + uVar63;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar69;
  uVar60 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,8);
  uVar65 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,0);
  uVar82 = uVar62 + uVar65;
  uVar65 = (ulong)CARRY8(uVar62,uVar65);
  uVar71 = uVar67 + uVar60;
  uVar81 = uVar71 + uVar65;
  uVar84 = uVar82 + uVar68;
  uVar62 = (ulong)CARRY8(uVar82,uVar68);
  uVar82 = uVar81 + uVar62;
  uVar67 = (ulong)CARRY8(uVar75,uVar61) + (ulong)(CARRY8(uVar66,uVar72) || CARRY8(uVar64,uVar63)) +
           (ulong)(CARRY8(uVar67,uVar60) || CARRY8(uVar71,uVar65)) + (ulong)CARRY8(uVar81,uVar62);
  uVar65 = uVar82 + uVar88;
  uVar61 = (ulong)CARRY8(uVar82,uVar88);
  uVar81 = uVar67 + uVar61;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_40;
  uVar72 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,8);
  uVar63 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,0);
  uVar62 = uVar65 + uVar63;
  uVar63 = (ulong)CARRY8(uVar65,uVar63);
  uVar64 = uVar81 + uVar72;
  uVar82 = uVar64 + uVar63;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_48;
  uVar60 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,8);
  uVar65 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,0);
  uVar75 = uVar62 + uVar65;
  uVar65 = (ulong)CARRY8(uVar62,uVar65);
  uVar71 = uVar82 + uVar60;
  uVar68 = uVar71 + uVar65;
  uVar66 = uVar75 + uVar69;
  uVar62 = (ulong)CARRY8(uVar75,uVar69);
  uVar75 = uVar68 + uVar62;
  uVar64 = (ulong)CARRY8(uVar67,uVar61) + (ulong)(CARRY8(uVar81,uVar72) || CARRY8(uVar64,uVar63)) +
           (ulong)(CARRY8(uVar82,uVar60) || CARRY8(uVar71,uVar65)) + (ulong)CARRY8(uVar68,uVar62);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_40;
  uVar62 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar42,8);
  uVar61 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar42,0);
  uVar63 = uVar75 + uVar61;
  uVar61 = (ulong)CARRY8(uVar75,uVar61);
  uVar65 = uVar64 + uVar62;
  uVar71 = uVar65 + uVar61;
  auVar58._8_8_ = uVar71;
  auVar58._0_8_ = uVar63;
  uVar69 = SUB168(auVar51 + auVar58,0);
  uVar63 = (ulong)CARRY8(uVar63,local_48);
  uVar60 = SUB168(auVar51 + auVar58,8);
  uVar75 = (ulong)(CARRY8(uVar64,uVar62) || CARRY8(uVar65,uVar61)) + (ulong)CARRY8(uVar71,uVar63) +
           (ulong)CARRY8(uVar71 + uVar63,local_40);
  auVar56._8_8_ = uVar75;
  auVar56._0_8_ = uVar60;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auVar52._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar69;
  auVar53 = ZEXT816(0x402da1732fc9bebf) * auVar43 + auVar53;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = auVar53._0_8_;
  uVar61 = auVar53._8_8_;
  uVar65 = uVar61 + uVar70;
  uVar61 = (ulong)CARRY8(uVar61,uVar70);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar60;
  uVar71 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar44,8);
  uVar63 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar44,0);
  uVar64 = uVar65 + uVar63;
  uVar63 = (ulong)CARRY8(uVar65,uVar63);
  uVar62 = uVar61 + uVar71;
  uVar67 = uVar62 + uVar63;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar69;
  uVar72 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar45,8);
  uVar65 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar45,0);
  uVar70 = uVar64 + uVar65;
  uVar65 = (ulong)CARRY8(uVar64,uVar65);
  uVar64 = uVar67 + uVar72;
  uVar81 = uVar64 + uVar65;
  uVar67 = (ulong)(CARRY8(uVar61,uVar71) || CARRY8(uVar62,uVar63)) +
           (ulong)(CARRY8(uVar67,uVar72) || CARRY8(uVar64,uVar65));
  uVar65 = uVar81 + uVar84;
  uVar61 = (ulong)CARRY8(uVar81,uVar84);
  uVar81 = uVar67 + uVar61;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar75;
  uVar72 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,8);
  uVar63 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,0);
  uVar62 = uVar65 + uVar63;
  uVar63 = (ulong)CARRY8(uVar65,uVar63);
  uVar64 = uVar81 + uVar72;
  uVar82 = uVar64 + uVar63;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar60;
  uVar60 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,8);
  uVar65 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,0);
  uVar84 = uVar62 + uVar65;
  uVar65 = (ulong)CARRY8(uVar62,uVar65);
  uVar71 = uVar82 + uVar60;
  uVar68 = uVar71 + uVar65;
  uVar85 = uVar84 + uVar69;
  uVar62 = (ulong)CARRY8(uVar84,uVar69);
  uVar69 = uVar68 + uVar62;
  auVar54._8_8_ =
       (ulong)CARRY8(uVar67,uVar61) + (ulong)(CARRY8(uVar81,uVar72) || CARRY8(uVar64,uVar63)) +
       (ulong)(CARRY8(uVar82,uVar60) || CARRY8(uVar71,uVar65)) + (ulong)CARRY8(uVar68,uVar62) +
       (ulong)CARRY8(uVar69,uVar66);
  auVar54._0_8_ = uVar69 + uVar66;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar75;
  auVar56 = ZEXT816(0x4551231950b75fc4) * auVar48 + auVar54 + auVar56;
  uVar65 = auVar56._0_8_;
  uVar63 = auVar56._8_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar63;
  auVar59 = ZEXT816(0x402da1732fc9bebf) * auVar49 + auVar59;
  uVar61 = auVar59._8_8_;
  r->d[0] = auVar59._0_8_;
  auVar55[8] = CARRY8(uVar61,uVar70);
  auVar55._0_8_ = uVar61 + uVar70;
  auVar55._9_7_ = 0;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar63;
  auVar55 = ZEXT816(0x4551231950b75fc4) * auVar50 + auVar55;
  uVar61 = auVar55._8_8_;
  r->d[1] = auVar55._0_8_;
  uVar64 = uVar61 + uVar63;
  uVar62 = (ulong)CARRY8(uVar61,uVar63) + (ulong)CARRY8(uVar64,uVar85);
  r->d[2] = uVar64 + uVar85;
  r->d[3] = uVar62 + uVar65;
  uVar2 = r->d[3];
  uVar61 = r->d[2];
  uVar1 = r->d[2];
  auVar89[0] = -((char)uVar1 == -1);
  auVar89[1] = -((char)(uVar1 >> 8) == -1);
  auVar89[2] = -((char)(uVar1 >> 0x10) == -1);
  auVar89[3] = -((char)(uVar1 >> 0x18) == -1);
  auVar89[4] = -((char)(uVar1 >> 0x20) == -1);
  auVar89[5] = -((char)(uVar1 >> 0x28) == -1);
  auVar89[6] = -((char)(uVar1 >> 0x30) == -1);
  auVar89[7] = -((char)(uVar1 >> 0x38) == -1);
  auVar89[8] = 0xff;
  auVar89[9] = 0xff;
  auVar89[10] = 0xff;
  auVar89[0xb] = 0xff;
  auVar89[0xc] = 0xff;
  auVar89[0xd] = 0xff;
  auVar89[0xe] = 0xff;
  auVar89[0xf] = 0xff;
  uVar63 = r->d[1];
  uVar74 = (uint)((0xfffffffffffffffd < uVar61 && uVar2 == 0xffffffffffffffff) &&
                 0xbaaedce6af48a03a < uVar63);
  uVar80 = 0;
  if (0xbaaedce6af48a03b < uVar63) {
    uVar80 = uVar74;
  }
  uVar64 = r->d[0];
  uVar73 = 0;
  if (0xbfd25e8cd0364140 < uVar64) {
    uVar73 = uVar74;
  }
  local_e0 = (uint)CARRY8(uVar62,uVar65);
  uVar71 = (ulong)((uVar73 | uVar80 | ((ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1) |
                                                (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                                                (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                                                (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                                                (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                                                (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                                                (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                                                (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                                                (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                                                (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                                                (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                                                (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                                                (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                                                (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                                                (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe |
                                               0x8000) == 0xffff && uVar2 == 0xffffffffffffffff)) +
                  local_e0);
  uVar65 = (ulong)CARRY8(uVar71 * 0x402da1732fc9bebf,uVar64);
  uVar62 = uVar71 * 0x4551231950b75fc4 + uVar63;
  r->d[0] = uVar71 * 0x402da1732fc9bebf + uVar64;
  r->d[1] = uVar62 + uVar65;
  uVar63 = (ulong)(CARRY8(uVar71 * 0x4551231950b75fc4,uVar63) || CARRY8(uVar62,uVar65));
  r->d[2] = uVar71 + uVar61 + uVar63;
  r->d[3] = uVar2 + (CARRY8(uVar71,uVar61) || CARRY8(uVar71 + uVar61,uVar63));
  return;
}

Assistant:

static void secp256k1_scalar_mul(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    uint64_t l[8];
    secp256k1_scalar_mul_512(l, a, b);
    secp256k1_scalar_reduce_512(r, l);
}